

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IFCReaderGen_2x3.h
# Opt level: O0

void __thiscall
Assimp::IFC::Schema_2x3::IfcWorkControl::IfcWorkControl(IfcWorkControl *this,void **vtt)

{
  void **vtt_local;
  IfcWorkControl *this_local;
  
  IfcControl::IfcControl((IfcControl *)this,vtt + 1);
  STEP::ObjectHelper<Assimp::IFC::Schema_2x3::IfcWorkControl,_10UL>::ObjectHelper
            (&this->super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcWorkControl,_10UL>,vtt + 0x17);
  *(void **)this = *vtt;
  *(void **)(&this->field_0x0 + *(long *)(*(long *)this + -0x18)) = vtt[0x19];
  *(void **)&this->field_0x88 = vtt[0x1a];
  *(void **)&this->field_0x98 = vtt[0x1b];
  *(void **)&this->field_0xd0 = vtt[0x1c];
  (this->super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcWorkControl,_10UL>)._vptr_ObjectHelper =
       (_func_int **)vtt[0x1d];
  std::__cxx11::string::string
            ((string *)
             &(this->super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcWorkControl,_10UL>).field_0x10);
  std::shared_ptr<const_Assimp::STEP::EXPRESS::DataType>::shared_ptr(&this->CreationDate);
  STEP::
  Maybe<Assimp::STEP::ListOf<Assimp::STEP::Lazy<Assimp::IFC::Schema_2x3::NotImplemented>,_1UL,_0UL>_>
  ::Maybe(&this->Creators);
  STEP::Maybe<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  Maybe(&this->Purpose);
  STEP::Maybe<double>::Maybe(&this->Duration);
  STEP::Maybe<double>::Maybe(&this->TotalFloat);
  std::shared_ptr<const_Assimp::STEP::EXPRESS::DataType>::shared_ptr(&this->StartTime);
  STEP::Maybe<std::shared_ptr<const_Assimp::STEP::EXPRESS::DataType>_>::Maybe(&this->FinishTime);
  STEP::Maybe<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  Maybe(&this->WorkControlType);
  STEP::Maybe<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  Maybe(&this->UserDefinedControlType);
  return;
}

Assistant:

IfcWorkControl() : Object("IfcWorkControl") {}